

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall
CLIntercept::addCommandBufferInfo
          (CLIntercept *this,cl_command_buffer_khr cmdbuf,cl_command_queue queue)

{
  cl_platform_id p_Var1;
  mapped_type *pp_Var2;
  cl_command_buffer_khr local_20;
  
  if (cmdbuf != (cl_command_buffer_khr)0x0) {
    local_20 = cmdbuf;
    std::mutex::lock(&this->m_Mutex);
    p_Var1 = getPlatform(this,queue);
    pp_Var2 = std::
              map<_cl_command_buffer_khr_*,__cl_platform_id_*,_std::less<_cl_command_buffer_khr_*>,_std::allocator<std::pair<_cl_command_buffer_khr_*const,__cl_platform_id_*>_>_>
              ::operator[](&this->m_CommandBufferInfoMap,&local_20);
    *pp_Var2 = p_Var1;
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
  }
  return;
}

Assistant:

void CLIntercept::addCommandBufferInfo(
    cl_command_buffer_khr cmdbuf,
    cl_command_queue queue )
{
    if( cmdbuf )
    {
        std::lock_guard<std::mutex> lock(m_Mutex);

        m_CommandBufferInfoMap[cmdbuf] = getPlatform(queue);
    }
}